

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

bool32 rw::instColor(int type,uint8 *dst,RGBA *src,uint32 numVertices,uint32 stride)

{
  uint local_34;
  uint local_30;
  uint32 i_1;
  uint32 i;
  uint8 alpha;
  uint32 stride_local;
  uint32 numVertices_local;
  RGBA *src_local;
  uint8 *dst_local;
  int type_local;
  
  i_1._3_1_ = 0xff;
  _stride_local = src;
  src_local = (RGBA *)dst;
  if (type == 10) {
    for (local_30 = 0; local_30 < numVertices; local_30 = local_30 + 1) {
      src_local->red = _stride_local->blue;
      src_local->green = _stride_local->green;
      src_local->blue = _stride_local->red;
      src_local->alpha = _stride_local->alpha;
      i_1._3_1_ = i_1._3_1_ & _stride_local->alpha;
      src_local = (RGBA *)(&src_local->red + stride);
      _stride_local = _stride_local + 1;
    }
  }
  else if (type == 0xb) {
    for (local_34 = 0; local_34 < numVertices; local_34 = local_34 + 1) {
      src_local->red = _stride_local->red;
      src_local->green = _stride_local->green;
      src_local->blue = _stride_local->blue;
      src_local->alpha = _stride_local->alpha;
      i_1._3_1_ = i_1._3_1_ & _stride_local->alpha;
      src_local = (RGBA *)(&src_local->red + stride);
      _stride_local = _stride_local + 1;
    }
  }
  return (bool32)(i_1._3_1_ != 0xff);
}

Assistant:

bool32
instColor(int type, uint8 *dst, RGBA *src, uint32 numVertices, uint32 stride)
{
	uint8 alpha = 0xFF;
	if(type == VERT_ARGB){
		for(uint32 i = 0; i < numVertices; i++){
			dst[0] = src->blue;
			dst[1] = src->green;
			dst[2] = src->red;
			dst[3] = src->alpha;
			alpha &= src->alpha;
			dst += stride;
			src++;
		}
	}else if(type == VERT_RGBA){
		for(uint32 i = 0; i < numVertices; i++){
			dst[0] = src->red;
			dst[1] = src->green;
			dst[2] = src->blue;
			dst[3] = src->alpha;
			alpha &= src->alpha;
			dst += stride;
			src++;
		}
	}else
		assert(0 && "unsupported color type");
	return alpha != 0xFF;
}